

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

int vkt::tessellation::getRoundedTessLevel(SpacingMode mode,float clampedTessLevel)

{
  uint uVar1;
  float fVar2;
  
  fVar2 = ceilf(clampedTessLevel);
  uVar1 = (uint)fVar2;
  if (mode == SPACINGMODE_FRACTIONAL_EVEN) {
    uVar1 = uVar1 + (int)uVar1 % 2;
  }
  else if (mode == SPACINGMODE_FRACTIONAL_ODD) {
    uVar1 = uVar1 - ((int)uVar1 >> 0x1f) | 1;
  }
  return uVar1;
}

Assistant:

int getRoundedTessLevel (const SpacingMode mode, const float clampedTessLevel)
{
	static const int minimumMaxTessGenLevel = 64;	//!< Minimum maxTessellationGenerationLevel defined by the spec.

	int result = (int)deFloatCeil(clampedTessLevel);

	switch (mode)
	{
		case SPACINGMODE_EQUAL:											break;
		case SPACINGMODE_FRACTIONAL_ODD:	result += 1 - result % 2;	break;
		case SPACINGMODE_FRACTIONAL_EVEN:	result += result % 2;		break;
		default:
			DE_ASSERT(false);
	}
	DE_ASSERT(de::inRange<int>(result, 1, minimumMaxTessGenLevel));
	DE_UNREF(minimumMaxTessGenLevel);

	return result;
}